

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlocalsocket.cpp
# Opt level: O0

int __thiscall QLocalSocket::qt_metacall(QLocalSocket *this,Call _c,int _id,void **_a)

{
  uint in_EDX;
  int in_ESI;
  Call in_EDI;
  void **in_stack_00000048;
  int in_stack_00000050;
  Call in_stack_00000054;
  QObject *in_stack_00000058;
  undefined4 local_18;
  undefined4 local_4;
  
  local_18 = QIODevice::qt_metacall(in_EDI,in_ESI,(void **)(ulong)in_EDX);
  local_4 = local_18;
  if (-1 < local_18) {
    if (in_ESI == 0) {
      if (local_18 < 8) {
        qt_static_metacall(in_stack_00000058,in_stack_00000054,in_stack_00000050,in_stack_00000048);
      }
      local_18 = local_18 + -8;
    }
    if (in_ESI == 7) {
      if (local_18 < 8) {
        qt_static_metacall(in_stack_00000058,in_stack_00000054,in_stack_00000050,in_stack_00000048);
      }
      local_18 = local_18 + -8;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall(in_stack_00000058,in_stack_00000054,in_stack_00000050,in_stack_00000048);
      local_18 = local_18 + -1;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int QLocalSocket::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QIODevice::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 8)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 8;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 8)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 8;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    return _id;
}